

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O2

Material * __thiscall Assimp::D3DS::Material::operator=(Material *this,Material *other)

{
  ai_real aVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->mName);
  (this->mDiffuse).r = (other->mDiffuse).r;
  (this->mDiffuse).g = (other->mDiffuse).g;
  (this->mDiffuse).b = (other->mDiffuse).b;
  aVar1 = other->mShininessStrength;
  this->mSpecularExponent = other->mSpecularExponent;
  this->mShininessStrength = aVar1;
  (this->mSpecular).r = (other->mSpecular).r;
  (this->mSpecular).g = (other->mSpecular).g;
  (this->mSpecular).b = (other->mSpecular).b;
  (this->mAmbient).r = (other->mAmbient).r;
  (this->mAmbient).g = (other->mAmbient).g;
  (this->mAmbient).b = (other->mAmbient).b;
  aVar1 = other->mTransparency;
  this->mShading = other->mShading;
  this->mTransparency = aVar1;
  D3DS::Texture::operator=(&this->sTexDiffuse,&other->sTexDiffuse);
  D3DS::Texture::operator=(&this->sTexOpacity,&other->sTexOpacity);
  D3DS::Texture::operator=(&this->sTexSpecular,&other->sTexSpecular);
  D3DS::Texture::operator=(&this->sTexReflective,&other->sTexReflective);
  D3DS::Texture::operator=(&this->sTexBump,&other->sTexBump);
  D3DS::Texture::operator=(&this->sTexEmissive,&other->sTexEmissive);
  D3DS::Texture::operator=(&this->sTexShininess,&other->sTexShininess);
  this->mBumpHeight = other->mBumpHeight;
  (this->mEmissive).r = (other->mEmissive).r;
  (this->mEmissive).g = (other->mEmissive).g;
  (this->mEmissive).b = (other->mEmissive).b;
  D3DS::Texture::operator=(&this->sTexAmbient,&other->sTexAmbient);
  this->mTwoSided = other->mTwoSided;
  return this;
}

Assistant:

Material &operator=(const Material &other) = default;